

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileIoTests.c
# Opt level: O2

void runFileIOTests(void)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  _Bool _Var3;
  int iVar4;
  uint64_t uVar5;
  int_fast32_t iVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *__function;
  char cVar11;
  uint uVar12;
  char *__assertion;
  
  printf("testFileExists()");
  _Var3 = exists((uint8_t *)"tests/simple_lines.dat");
  if (_Var3) {
    _Var3 = exists((uint8_t *)"tests/obviously_invalid_file");
    if (_Var3) {
      __assertion = "exists((uint8_t*)\"tests/obviously_invalid_file\") == false";
      __function = "void testFileExists()";
      uVar12 = 7;
    }
    else {
      puts(" passed");
      printf("testGetSize()");
      uVar5 = getFileSize((uint8_t *)"tests/empty_file");
      if (uVar5 == 0) {
        uVar5 = getFileSize((uint8_t *)"tests/null_file");
        if (uVar5 == 0) {
          uVar5 = getFileSize((uint8_t *)"tests/simple_lines.dat");
          if (uVar5 == 0x870) {
            puts(" passed");
            printf("testReadBlock()");
            iVar6 = openForRead((uint8_t *)"tests/simple_lines.dat");
            uVar12 = (uint)iVar6;
            if ((int)uVar12 < 1) {
              __assertion = "read > 0";
              __function = "void testReadBytes()";
              uVar12 = 0x18;
            }
            else {
              uVar5 = getFileSize((uint8_t *)"tests/simple_lines.dat");
              for (; uVar5 != 0; uVar5 = uVar5 - 0x1b) {
                puVar7 = readBytes(0x1b,(ulong)(uVar12 & 0x7fffffff));
                iVar4 = bcmp(puVar7,"abcdefghijklmnopqrstuvwxyz\n",0x1b);
                if (iVar4 != 0) {
                  __assertion = "memcmp(line, REF_LINE, TEST_FILE_LINE_LENGTH) == 0";
                  __function = "void testReadBytes()";
                  uVar12 = 0x1e;
                  goto LAB_0010488e;
                }
                free(puVar7);
              }
              puts(" passed");
              close(uVar12);
              printf("testWriteBytes()");
              uVar8 = openForWrite((uint8_t *)"writeTest.dat");
              uVar9 = openForRead((uint8_t *)"writeTest.dat");
              if ((int)uVar8 < 1) {
                __assertion = "wr_fd > 0";
                __function = "void testWriteBytes()";
                uVar12 = 0x32;
              }
              else if ((int)uVar9 < 1) {
                __assertion = "re_fd > 0";
                __function = "void testWriteBytes()";
                uVar12 = 0x33;
              }
              else {
                for (cVar11 = '\0'; cVar11 != '\x1a'; cVar11 = cVar11 + '\x01') {
                  _Var3 = writeBytes("abcdefghijklmnoprqstuvwxyz\nskein_state.skeinSize == 256",0x1b
                                     ,uVar8 & 0x7fffffff);
                  if (!_Var3) {
                    __assertion = "writeBytes(alphabet, a_size, wr_fd) == true";
                    __function = "void testWriteBytes()";
                    uVar12 = 0x37;
                    goto LAB_0010488e;
                  }
                  puVar7 = readBytes(0x1b,uVar9 & 0x7fffffff);
                  if (puVar7 == (uint8_t *)0x0) {
                    __assertion = "data != NULL";
                    __function = "void testWriteBytes()";
                    uVar12 = 0x3a;
                    goto LAB_0010488e;
                  }
                  lVar10 = 0;
                  while (lVar10 != 0x1b) {
                    puVar1 = puVar7 + lVar10;
                    puVar2 = &testWriteBytes_alphabet + lVar10;
                    lVar10 = lVar10 + 1;
                    if (*puVar1 != *puVar2) {
                      __assertion = "data[j] == alphabet[j]";
                      __function = "void testWriteBytes()";
                      uVar12 = 0x3d;
                      goto LAB_0010488e;
                    }
                  }
                  free(puVar7);
                }
                uVar5 = getFileSize((uint8_t *)"writeTest.dat");
                if (uVar5 == 0x2be) {
                  puts(" passed");
                  close((int)uVar8);
                  close((int)uVar9);
                  return;
                }
                __assertion = "getFileSize((uint8_t*)\"writeTest.dat\") == 702";
                __function = "void testWriteBytes()";
                uVar12 = 0x42;
              }
            }
          }
          else {
            __assertion = "getFileSize((uint8_t*)\"tests/simple_lines.dat\") == 2160LU";
            __function = "void testGetFileSize()";
            uVar12 = 0x10;
          }
        }
        else {
          __assertion = "getFileSize((uint8_t*)\"tests/null_file\") == 0LU";
          __function = "void testGetFileSize()";
          uVar12 = 0xf;
        }
      }
      else {
        __assertion = "getFileSize((uint8_t*)\"tests/empty_file\") == 0LU";
        __function = "void testGetFileSize()";
        uVar12 = 0xe;
      }
    }
  }
  else {
    __assertion = "exists((uint8_t*)\"tests/simple_lines.dat\") == true";
    __function = "void testFileExists()";
    uVar12 = 6;
  }
LAB_0010488e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                ,uVar12,__function);
}

Assistant:

static void testFileExists()
{
    printf("testFileExists()");
    assert(exists((uint8_t*)"tests/simple_lines.dat") == true);
    assert(exists((uint8_t*)"tests/obviously_invalid_file") == false);
    printf(" passed\n");
}